

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PotentialEnergyObjectiveFunction.cpp
# Opt level: O1

DynamicVector<double,_std::allocator<double>_> * __thiscall
OpenMD::PotentialEnergyObjectiveFunction::setInitialCoords
          (DynamicVector<double,_std::allocator<double>_> *__return_storage_ptr__,
          PotentialEnergyObjectiveFunction *this)

{
  ObjectType *pOVar1;
  double *pdVar2;
  double dVar3;
  pointer ppSVar4;
  pointer ppAVar5;
  Snapshot *pSVar6;
  pointer pdVar7;
  double dVar8;
  PotentialEnergyObjectiveFunction *pPVar9;
  Molecule *pMVar10;
  StuntDouble *pSVar11;
  long lVar12;
  pointer ppSVar13;
  pointer ppAVar14;
  int iVar15;
  long lVar16;
  pointer pdVar17;
  int iVar18;
  Atom *pAVar19;
  MoleculeIterator i;
  MoleculeIterator local_60;
  allocator_type local_51;
  PotentialEnergyObjectiveFunction *local_50;
  Vector3<double> local_48;
  
  local_60._M_node = (_Base_ptr)0x0;
  this->ndf_ = 0;
  pMVar10 = SimInfo::beginMolecule(this->info_,&local_60);
  if (pMVar10 != (Molecule *)0x0) {
    do {
      ppSVar13 = (pMVar10->integrableObjects_).
                 super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppSVar4 = (pMVar10->integrableObjects_).
                super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (ppSVar13 == ppSVar4) {
        pSVar11 = (StuntDouble *)0x0;
      }
      else {
        pSVar11 = *ppSVar13;
      }
      if (pSVar11 != (StuntDouble *)0x0) {
        iVar15 = this->ndf_;
        do {
          ppSVar13 = ppSVar13 + 1;
          pOVar1 = &pSVar11->objType_;
          if (ppSVar13 == ppSVar4) {
            pSVar11 = (StuntDouble *)0x0;
          }
          else {
            pSVar11 = *ppSVar13;
          }
          iVar15 = iVar15 + (uint)(*pOVar1 - otDAtom < 2) * 3 + 3;
        } while (pSVar11 != (StuntDouble *)0x0);
        this->ndf_ = iVar15;
      }
      pMVar10 = SimInfo::nextMolecule(this->info_,&local_60);
    } while (pMVar10 != (Molecule *)0x0);
  }
  if ((this->hasFlucQ_ == true) &&
     (pMVar10 = SimInfo::beginMolecule(this->info_,&local_60), pMVar10 != (Molecule *)0x0)) {
    do {
      ppAVar14 = (pMVar10->fluctuatingCharges_).
                 super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppAVar5 = (pMVar10->fluctuatingCharges_).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if ((ppAVar14 != ppAVar5) && (*ppAVar14 != (Atom *)0x0)) {
        iVar15 = this->ndf_;
        do {
          iVar15 = iVar15 + 1;
          ppAVar14 = ppAVar14 + 1;
          if (ppAVar14 == ppAVar5) break;
        } while (*ppAVar14 != (Atom *)0x0);
        this->ndf_ = iVar15;
      }
      pMVar10 = SimInfo::nextMolecule(this->info_,&local_60);
    } while (pMVar10 != (Molecule *)0x0);
  }
  local_48.super_Vector<double,_3U>.data_[0] = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            (&__return_storage_ptr__->data_,(long)this->ndf_,(value_type_conflict1 *)&local_48,
             &local_51);
  pMVar10 = SimInfo::beginMolecule(this->info_,&local_60);
  iVar15 = 0;
  local_50 = this;
  while (pPVar9 = local_50, pMVar10 != (Molecule *)0x0) {
    ppSVar13 = (pMVar10->integrableObjects_).
               super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (ppSVar13 ==
        (pMVar10->integrableObjects_).
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pSVar11 = (StuntDouble *)0x0;
    }
    else {
      pSVar11 = *ppSVar13;
    }
    while (pSVar11 != (StuntDouble *)0x0) {
      ppSVar13 = ppSVar13 + 1;
      pSVar6 = pSVar11->snapshotMan_->currentSnapshot_;
      lVar16 = (long)pSVar11->localIndex_;
      lVar12 = *(long *)((long)&(pSVar6->atomData).position.
                                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + pSVar11->storage_);
      dVar3 = *(double *)(lVar12 + 0x10 + lVar16 * 0x18);
      pdVar7 = (__return_storage_ptr__->data_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pdVar2 = (double *)(lVar12 + lVar16 * 0x18);
      dVar8 = pdVar2[1];
      pdVar17 = pdVar7 + iVar15;
      *pdVar17 = *pdVar2;
      pdVar17[1] = dVar8;
      iVar18 = iVar15 + 3;
      pdVar7[(long)iVar15 + 2] = dVar3;
      if (pSVar11->objType_ - otDAtom < 2) {
        SquareMatrix3<double>::toEulerAngles
                  (&local_48,
                   (SquareMatrix3<double> *)
                   (lVar16 * 0x48 +
                   *(long *)((long)&(pSVar6->atomData).aMat.
                                    super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + pSVar11->storage_)))
        ;
        lVar12 = (long)iVar18;
        iVar18 = iVar15 + 6;
        pdVar17 = (__return_storage_ptr__->data_).
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar17[lVar12] = local_48.super_Vector<double,_3U>.data_[0];
        pdVar17 = pdVar17 + (long)iVar15 + 4;
        *pdVar17 = local_48.super_Vector<double,_3U>.data_[1];
        pdVar17[1] = local_48.super_Vector<double,_3U>.data_[2];
      }
      iVar15 = iVar18;
      if (ppSVar13 ==
          (pMVar10->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pSVar11 = (StuntDouble *)0x0;
      }
      else {
        pSVar11 = *ppSVar13;
      }
    }
    pMVar10 = SimInfo::nextMolecule(local_50->info_,&local_60);
  }
  if (local_50->hasFlucQ_ == true) {
    pMVar10 = SimInfo::beginMolecule(local_50->info_,&local_60);
    while (pMVar10 != (Molecule *)0x0) {
      ppAVar14 = (pMVar10->fluctuatingCharges_).
                 super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppAVar5 = (pMVar10->fluctuatingCharges_).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppAVar14 == ppAVar5) {
        pAVar19 = (Atom *)0x0;
      }
      else {
        pAVar19 = *ppAVar14;
      }
      if (pAVar19 != (Atom *)0x0) {
        pdVar17 = (__return_storage_ptr__->data_).
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + iVar15;
        do {
          ppAVar14 = ppAVar14 + 1;
          *pdVar17 = *(double *)
                      (*(long *)((long)&(((pAVar19->super_StuntDouble).snapshotMan_)->
                                         currentSnapshot_->atomData).flucQPos.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start +
                                (pAVar19->super_StuntDouble).storage_) +
                      (long)(pAVar19->super_StuntDouble).localIndex_ * 8);
          if (ppAVar14 == ppAVar5) {
            pAVar19 = (Atom *)0x0;
          }
          else {
            pAVar19 = *ppAVar14;
          }
          pdVar17 = pdVar17 + 1;
          iVar15 = iVar15 + 1;
        } while (pAVar19 != (Atom *)0x0);
      }
      pMVar10 = SimInfo::nextMolecule(pPVar9->info_,&local_60);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

DynamicVector<RealType> PotentialEnergyObjectiveFunction::setInitialCoords() {
#ifdef IS_MPI
    MPI_Comm_size(MPI_COMM_WORLD, &nproc_);
    MPI_Comm_rank(MPI_COMM_WORLD, &myrank_);
    std::vector<int> onProc(nproc_, 0);

    displacements_.clear();
    displacements_.resize(nproc_, 0);
#endif

    SimInfo::MoleculeIterator i;
    Molecule::IntegrableObjectIterator j;
    Molecule::AtomIterator ai;
    Molecule* mol;
    StuntDouble* sd;
    Atom* atom;

    Vector3d pos;
    Vector3d eulerAngle;

    ndf_ = 0;

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        ndf_ += 3;

        if (sd->isDirectional()) { ndf_ += 3; }
      }
    }

    if (hasFlucQ_) {
      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (atom = mol->beginFluctuatingCharge(ai); atom != NULL;
             atom = mol->nextFluctuatingCharge(ai)) {
          ndf_++;
        }
      }
    }

#ifdef IS_MPI
    MPI_Allgather(&ndf_, 1, MPI_INT, &onProc[0], 1, MPI_INT, MPI_COMM_WORLD);

    ndf_ = 0;
    for (int iproc = 0; iproc < nproc_; iproc++) {
      ndf_ += onProc[iproc];
    }

    displacements_[0] = 0;
    for (int iproc = 1; iproc < nproc_; iproc++) {
      displacements_[iproc] = displacements_[iproc - 1] + onProc[iproc - 1];
    }
#endif

    DynamicVector<RealType> xinit(ndf_, 0.0);

    int index;
#ifdef IS_MPI
    index = displacements_[myrank_];
#else
    index = 0;
#endif

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        pos            = sd->getPos();
        xinit[index++] = pos[0];
        xinit[index++] = pos[1];
        xinit[index++] = pos[2];

        if (sd->isDirectional()) {
          eulerAngle     = sd->getEuler();
          xinit[index++] = eulerAngle[0];
          xinit[index++] = eulerAngle[1];
          xinit[index++] = eulerAngle[2];
        }
      }
    }

    if (hasFlucQ_) {
      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (atom = mol->beginFluctuatingCharge(ai); atom != NULL;
             atom = mol->nextFluctuatingCharge(ai)) {
          xinit[index++] = atom->getFlucQPos();
        }
      }
    }

    return xinit;
  }